

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

qsizetype __thiscall QVLABase<char>::indexOf<char>(QVLABase<char> *this,char *t,qsizetype from)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar2 = (this->super_QVLABaseBase).s;
  lVar4 = 0;
  if (0 < lVar2 + from) {
    lVar4 = lVar2 + from;
  }
  if (-1 < from) {
    lVar4 = from;
  }
  if (lVar4 < lVar2) {
    lVar4 = lVar4 + -1;
    while (lVar4 - lVar2 != -1) {
      lVar1 = lVar4 + 1;
      lVar3 = lVar4 + 1;
      lVar4 = lVar1;
      if (*(char *)((long)(this->super_QVLABaseBase).ptr + lVar3) == *t) {
        return lVar1;
      }
    }
  }
  return -1;
}

Assistant:

Q_INLINE_TEMPLATE qsizetype QVLABase<T>::indexOf(const AT &t, qsizetype from) const
{
    if (from < 0)
        from = qMax(from + size(), qsizetype(0));
    if (from < size()) {
        const T *n = data() + from - 1;
        const T *e = end();
        while (++n != e)
            if (*n == t)
                return n - data();
    }
    return -1;
}